

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.cpp
# Opt level: O1

string_t duckdb::HexIntegralOperator::Operation<long,duckdb::string_t>(long input,Vector *result)

{
  anon_union_16_2_67f50693_for_value aVar1;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  undefined1 auVar5 [16];
  string_t target;
  uint local_20;
  undefined4 uStack_1c;
  char *local_18;
  
  if (input == 0) {
    uVar2 = 3;
  }
  else {
    uVar2 = (ulong)input >> 1 | input;
    uVar2 = uVar2 >> 2 | uVar2;
    uVar2 = uVar2 >> 4 | uVar2;
    uVar2 = uVar2 >> 8 | uVar2;
    uVar2 = uVar2 >> 0x10 | uVar2;
    uVar2 = *(long *)(&DAT_00780400 + ((uVar2 >> 0x20 | uVar2) * 0x3f79d71b4cb0a89 >> 0x3a) * 8) + 4
    ;
  }
  if (uVar2 < 4) {
    auVar5 = duckdb::StringVector::EmptyString(result,1);
    local_18 = auVar5._8_8_;
    local_20 = auVar5._0_4_;
    uStack_1c = auVar5._4_4_;
    pcVar3 = local_18;
    if (local_20 < 0xd) {
      pcVar3 = (char *)&uStack_1c;
    }
    *pcVar3 = '0';
  }
  else {
    auVar5 = duckdb::StringVector::EmptyString(result,uVar2 >> 2);
    local_18 = auVar5._8_8_;
    local_20 = auVar5._0_4_;
    uStack_1c = auVar5._4_4_;
    pcVar3 = local_18;
    if (local_20 < 0xd) {
      pcVar3 = (char *)&uStack_1c;
    }
    lVar4 = (uVar2 & 0xfffffffffffffffc) - 4;
    do {
      *pcVar3 = "0123456789ABCDEF"[(uint)((ulong)input >> ((byte)lVar4 & 0x3f)) & 0xf];
      pcVar3 = pcVar3 + 1;
      lVar4 = lVar4 + -4;
    } while (lVar4 != -4);
  }
  uVar2 = (ulong)local_20;
  if (uVar2 < 0xd) {
    memset((void *)((long)&uStack_1c + uVar2),0,0xc - uVar2);
  }
  else {
    uStack_1c = *(undefined4 *)local_18;
  }
  aVar1._4_1_ = (undefined1)uStack_1c;
  aVar1._5_1_ = uStack_1c._1_1_;
  aVar1._6_1_ = uStack_1c._2_1_;
  aVar1._7_1_ = uStack_1c._3_1_;
  aVar1.pointer.length = local_20;
  aVar1.pointer.ptr = local_18;
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {

		auto num_leading_zero = CountZeros<uint64_t>::Leading(static_cast<uint64_t>(input));
		idx_t num_bits_to_check = 64 - num_leading_zero;
		D_ASSERT(num_bits_to_check <= sizeof(INPUT_TYPE) * 8);

		idx_t buffer_size = (num_bits_to_check + 3) / 4;

		// Special case: All bits are zero
		if (buffer_size == 0) {
			auto target = StringVector::EmptyString(result, 1);
			auto output = target.GetDataWriteable();
			*output = '0';
			target.Finalize();
			return target;
		}

		D_ASSERT(buffer_size > 0);
		auto target = StringVector::EmptyString(result, buffer_size);
		auto output = target.GetDataWriteable();

		WriteHexBytes(static_cast<uint64_t>(input), output, buffer_size);

		target.Finalize();
		return target;
	}